

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_popcnt32_mask(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined8 uVar1;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int i_3;
  int j;
  int i_2;
  int i_1;
  uint32_t n_cycles;
  __m512i *data_vectors;
  uint32_t out_counters [16];
  int i;
  __m512i masks [16];
  int local_e2c;
  int local_e28;
  uint local_e24;
  uint local_e20;
  int local_e10 [19];
  uint local_dc4;
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  long local_998;
  uint local_98c;
  long local_988;
  undefined1 local_980 [64];
  uint local_904;
  
  for (local_dc4 = 0; (int)local_dc4 < 0x10; local_dc4 = local_dc4 + 1) {
    local_904 = (1 << (local_dc4 & 0x1f)) << 0x10 | 1 << (local_dc4 & 0x1f);
    auVar2 = vpbroadcastd_avx512f(ZEXT416(local_904));
    local_980 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_980);
    auVar2 = vmovdqa64_avx512f(auVar2);
    *(undefined1 (*) [64])(local_dc0 + (long)(int)local_dc4 * 0x40) = auVar2;
  }
  local_998 = in_RDX;
  local_98c = in_ESI;
  local_988 = in_RDI;
  memset(local_e10,0,0x40);
  for (local_e20 = 0; local_e20 < local_98c >> 5; local_e20 = local_e20 + 1) {
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_dc0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_dc0);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0] = local_e10[0] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_d80);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_d80);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[1] = local_e10[1] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_d40);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_d40);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[2] = local_e10[2] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_d00);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_d00);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[3] = local_e10[3] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_cc0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_cc0);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[4] = local_e10[4] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_c80);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_c80);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[5] = local_e10[5] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_c40);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_c40);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[6] = local_e10[6] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_c00);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_c00);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[7] = local_e10[7] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_bc0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_bc0);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[8] = local_e10[8] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_b80);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_b80);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[9] = local_e10[9] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_b40);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_b40);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[10] = local_e10[10] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_b00);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_b00);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0xb] = local_e10[0xb] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_ac0);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0xc] = local_e10[0xc] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_a80);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_a80);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0xd] = local_e10[0xd] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_a40);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_a40);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0xe] = local_e10[0xe] + POPCOUNT((int)uVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_988 + (long)(int)local_e20 * 0x40));
    auVar3 = vmovdqa64_avx512f(local_a00);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar3 = vmovdqa64_avx512f(local_a00);
    uVar1 = vpcmpeqw_avx512bw(auVar2,auVar3);
    local_e10[0xf] = (int)POPCOUNT(uVar1) + local_e10[0xf];
  }
  for (local_e24 = (local_98c >> 5) << 5; local_e24 < local_98c; local_e24 = local_e24 + 1) {
    for (local_e28 = 0; local_e28 < 0x10; local_e28 = local_e28 + 1) {
      local_e10[local_e28] =
           ((int)((uint)*(ushort *)(local_988 + (long)(int)local_e24 * 2) &
                 1 << ((byte)local_e28 & 0x1f)) >> ((byte)local_e28 & 0x1f)) + local_e10[local_e28];
    }
  }
  for (local_e2c = 0; local_e2c < 0x10; local_e2c = local_e2c + 1) {
    *(int *)(local_998 + (long)local_e2c * 4) = local_e10[local_e2c];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_popcnt32_mask(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm512_set1_epi32(((1 << i) << 16) | (1 << i));
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) out_counters[pos] += PIL_POPCOUNT((uint64_t)_mm512_cmpeq_epu16_mask(_mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]), masks[pos]));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef BLOCK
#undef UPDATE

    return 0;
}